

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

UniDirectionalLSTMLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_unidirectionallstm(NeuralNetworkLayer *this)

{
  bool bVar1;
  UniDirectionalLSTMLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_unidirectionallstm(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_unidirectionallstm(this);
    this_00 = (UniDirectionalLSTMLayerParams *)operator_new(0x50);
    UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams(this_00);
    (this->layer_).unidirectionallstm_ = this_00;
  }
  return (UniDirectionalLSTMLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::UniDirectionalLSTMLayerParams* NeuralNetworkLayer::mutable_unidirectionallstm() {
  if (!has_unidirectionallstm()) {
    clear_layer();
    set_has_unidirectionallstm();
    layer_.unidirectionallstm_ = new ::CoreML::Specification::UniDirectionalLSTMLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.uniDirectionalLSTM)
  return layer_.unidirectionallstm_;
}